

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddChild<std::vector<double,std::allocator<double>>>
          (Node *this,string *name,vector<double,_std::allocator<double>_> *more)

{
  vector<double,_std::allocator<double>_> local_a8;
  undefined1 local_90 [8];
  Node c;
  vector<double,_std::allocator<double>_> *more_local;
  string *name_local;
  Node *this_local;
  
  c.property_start = (size_t)more;
  Node((Node *)local_90,name);
  std::vector<double,_std::allocator<double>_>::vector(&local_a8,more);
  AddProperties<std::vector<double,std::allocator<double>>>((Node *)local_90,&local_a8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_a8);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }